

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O3

void QJsonPrivate::Writer::valueToJson(QCborValue *v,QByteArray *json,int indent,bool compact)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  long lVar3;
  long lVar4;
  
  if (v->container == (QCborContainerPrivate *)0x0) {
    lVar4 = 0x10;
  }
  else {
    lVar4 = (v->container->elements).d.size;
  }
  lVar4 = lVar4 + (json->d).size;
  pDVar2 = (json->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     (lVar3 = (pDVar2->super_QArrayData).alloc,
     (long)((((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) + lVar3) -
           (long)(json->d).ptr) < lVar4)) {
    QByteArray::reallocData(json,lVar4,KeepSize);
    pDVar2 = (json->d).d;
    if (pDVar2 == (Data *)0x0) goto LAB_002f901a;
    lVar3 = (pDVar2->super_QArrayData).alloc;
  }
  if (lVar3 != 0) {
    pAVar1 = &(pDVar2->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
LAB_002f901a:
  valueContentToJson(v,json,indent,compact);
  if ((!compact) && ((v->t | 0x20) == Map)) {
    QByteArray::append(json,'\n');
    return;
  }
  return;
}

Assistant:

void Writer::valueToJson(const QCborValue &v, QByteArray &json, int indent, bool compact)
{
    const QCborContainerPrivate *container = QJsonPrivate::Value::container(v);
    json.reserve(json.size() + (container ? container->elements.size() : 16));
    valueContentToJson(v, json, indent, compact);

    if (!compact && (v.isMap() || v.isArray())) {
        json.append('\n');
    }
}